

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# error.cpp
# Opt level: O2

void underline(int offset,int left,int right,char *text)

{
  int iVar1;
  int iVar2;
  ulong uVar3;
  long lVar4;
  undefined4 in_register_00000014;
  FILE *pFVar5;
  FILE *extraout_RDX;
  FILE *extraout_RDX_00;
  ulong uVar6;
  int iVar7;
  
  pFVar5 = (FILE *)CONCAT44(in_register_00000014,right);
  for (iVar7 = offset; 1 < iVar7; iVar7 = iVar7 + -1) {
    fputc(0x2d,_stderr);
    pFVar5 = extraout_RDX;
  }
  uVar3 = 0;
  uVar6 = 0;
  iVar7 = offset;
  if (0 < left) {
    uVar6 = (ulong)(uint)left;
  }
  for (; uVar6 != uVar3; uVar3 = uVar3 + 1) {
    iVar1 = 1;
    if (text[uVar3] == '\t') {
      pFVar5 = (FILE *)((long)iVar7 % 8 & 0xffffffff);
      iVar1 = 8 - (int)((long)iVar7 % 8);
    }
    iVar7 = iVar7 + iVar1;
  }
  fputnc(' ',(iVar7 - offset) + 1,pFVar5);
  pFVar5 = extraout_RDX_00;
  iVar1 = iVar7;
  for (lVar4 = (long)left; lVar4 <= right; lVar4 = lVar4 + 1) {
    iVar2 = 1;
    if (text[lVar4] == '\t') {
      pFVar5 = (FILE *)((long)iVar1 % 8 & 0xffffffff);
      iVar2 = 8 - (int)((long)iVar1 % 8);
    }
    iVar1 = iVar1 + iVar2;
  }
  fputnc('^',iVar1 - iVar7,pFVar5);
  return;
}

Assistant:

static void underline(int offset, int left, int right, const char *text) {
	auto column = offset;
	while (--offset > 0)
		fputc('-', stderr);
	auto column_ref = column;
	for (auto i = 0; i < left; ++i)
		column += (text[i] == '\t') ? 8 - column % 8 : 1;
	fputnc(' ', column - column_ref + 1, stderr);

	column_ref = column;
	for (auto i = left; i <= right;  ++i)
		column += text[i] == '\t' ? 8 - column % 8 : 1;
	fputnc('^', column - column_ref, stderr);

	// fprintf(stderr, " %d %d %d", offset, left, right);
}